

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

int Mop_ManMergeDist1All(Mop_Man_t *p,Vec_Wec_t *vGroups,Vec_Int_t *vStats,int nLimit)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *vGroupPrev;
  int local_48;
  int Count;
  int nReduce;
  int nEqual;
  int i;
  Vec_Int_t *vGroup;
  int nLimit_local;
  Vec_Int_t *vStats_local;
  Vec_Wec_t *vGroups_local;
  Mop_Man_t *p_local;
  
  local_48 = 0;
  nReduce = Vec_WecSize(vGroups);
  while( true ) {
    do {
      iVar2 = nReduce;
      nReduce = iVar2 + -1;
      if (nReduce < 0) {
        return local_48;
      }
      p_00 = Vec_WecEntry(vGroups,nReduce);
      iVar1 = Vec_IntSize(p_00);
    } while (iVar1 == 0);
    if (nReduce == 0) break;
    iVar1 = Mop_ManRemoveIdentical(p,p_00);
    vGroupPrev = Vec_WecEntry(vGroups,iVar2 + -2);
    iVar2 = Mop_ManMergeDist1Pairs(p,p_00,vGroupPrev,vStats,nLimit);
    local_48 = iVar1 + iVar2 + local_48;
  }
  printf("Detected constant-1 cover.\n");
  fflush(_stdout);
  return -1;
}

Assistant:

int Mop_ManMergeDist1All( Mop_Man_t * p, Vec_Wec_t * vGroups, Vec_Int_t * vStats, int nLimit )
{
    Vec_Int_t * vGroup;
    int i, nEqual, nReduce, Count = 0;
    Vec_WecForEachLevelReverse( vGroups, vGroup, i )
    {
        if ( Vec_IntSize(vGroup) == 0 )
            continue;
        if ( i == 0 )
        {
            printf( "Detected constant-1 cover.\n" );
            fflush( stdout );
            return -1;
        }
        nEqual  = Mop_ManRemoveIdentical( p, vGroup );
        nReduce = Mop_ManMergeDist1Pairs( p, vGroup, Vec_WecEntry(vGroups, i-1), vStats, nLimit );
        //Mop_ManMergeDist1Pairs2( p, vGroup, Vec_WecEntry(vGroups, i-1) );
        Count  += nEqual + nReduce;
        //printf( "Group %3d : Equal =%5d. Reduce =%5d.\n", i, nEqual, nReduce );
    }
    return Count;
}